

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match.cc
# Opt level: O0

bool bssl::anon_unknown_1::VerifyNameMatchInternal(Input a,Input b,NameMatchType match_type)

{
  bool bVar1;
  bool local_10a;
  bool local_109;
  undefined1 local_108 [8];
  Parser b_rdn;
  Parser a_rdn;
  undefined1 local_c8 [8];
  Parser b_rdn_sequence;
  undefined1 local_a0 [8];
  Parser a_rdn_sequence;
  undefined1 local_78 [8];
  Parser b_rdn_sequence_counter;
  undefined1 local_50 [8];
  Parser a_rdn_sequence_counter;
  NameMatchType match_type_local;
  Input b_local;
  Input a_local;
  
  b_rdn_sequence_counter.advance_len_ = (size_t)a.data_.data_;
  a_rdn_sequence_counter.advance_len_._4_4_ = match_type;
  bssl::der::Parser::Parser((Parser *)local_50,a);
  a_rdn_sequence.advance_len_ = (size_t)b.data_.data_;
  bssl::der::Parser::Parser((Parser *)local_78,b);
  while( true ) {
    bVar1 = bssl::der::Parser::HasMore((Parser *)local_50);
    local_109 = false;
    if (bVar1) {
      local_109 = bssl::der::Parser::HasMore((Parser *)local_78);
    }
    if (local_109 == false) break;
    bVar1 = bssl::der::Parser::SkipTag((Parser *)local_50,0x20000011);
    if ((!bVar1) || (bVar1 = bssl::der::Parser::SkipTag((Parser *)local_78,0x20000011), !bVar1)) {
      return false;
    }
  }
  bVar1 = bssl::der::Parser::HasMore((Parser *)local_78);
  if (bVar1) {
    return false;
  }
  if ((a_rdn_sequence_counter.advance_len_._4_4_ == EXACT_MATCH) &&
     (bVar1 = bssl::der::Parser::HasMore((Parser *)local_50), bVar1)) {
    return false;
  }
  b_rdn_sequence.advance_len_ = (size_t)a.data_.data_;
  bssl::der::Parser::Parser((Parser *)local_a0,a);
  bssl::der::Parser::Parser((Parser *)local_c8,b);
  while( true ) {
    bVar1 = bssl::der::Parser::HasMore((Parser *)local_a0);
    local_10a = false;
    if (bVar1) {
      local_10a = bssl::der::Parser::HasMore((Parser *)local_c8);
    }
    if (local_10a == false) break;
    bssl::der::Parser::Parser((Parser *)&b_rdn.advance_len_);
    bssl::der::Parser::Parser((Parser *)local_108);
    bVar1 = bssl::der::Parser::ReadConstructed
                      ((Parser *)local_a0,0x20000011,(Parser *)&b_rdn.advance_len_);
    if ((!bVar1) ||
       (bVar1 = bssl::der::Parser::ReadConstructed
                          ((Parser *)local_c8,0x20000011,(Parser *)local_108), !bVar1)) {
      return false;
    }
    bVar1 = VerifyRdnMatch((Parser *)&b_rdn.advance_len_,(Parser *)local_108);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool VerifyNameMatchInternal(der::Input a, der::Input b,
                             NameMatchType match_type) {
  // Empty Names are allowed.  RFC 5280 section 4.1.2.4 requires "The issuer
  // field MUST contain a non-empty distinguished name (DN)", while section
  // 4.1.2.6 allows for the Subject to be empty in certain cases. The caller is
  // assumed to have verified those conditions.

  // RFC 5280 section 7.1:
  // Two distinguished names DN1 and DN2 match if they have the same number of
  // RDNs, for each RDN in DN1 there is a matching RDN in DN2, and the matching
  // RDNs appear in the same order in both DNs.

  // As an optimization, first just compare the number of RDNs:
  der::Parser a_rdn_sequence_counter(a);
  der::Parser b_rdn_sequence_counter(b);
  while (a_rdn_sequence_counter.HasMore() && b_rdn_sequence_counter.HasMore()) {
    if (!a_rdn_sequence_counter.SkipTag(CBS_ASN1_SET) ||
        !b_rdn_sequence_counter.SkipTag(CBS_ASN1_SET)) {
      return false;
    }
  }
  // If doing exact match and either of the sequences has more elements than the
  // other, not a match. If doing a subtree match, the first Name may have more
  // RDNs than the second.
  if (b_rdn_sequence_counter.HasMore()) {
    return false;
  }
  if (match_type == EXACT_MATCH && a_rdn_sequence_counter.HasMore()) {
    return false;
  }

  // Verify that RDNs in |a| and |b| match.
  der::Parser a_rdn_sequence(a);
  der::Parser b_rdn_sequence(b);
  while (a_rdn_sequence.HasMore() && b_rdn_sequence.HasMore()) {
    der::Parser a_rdn, b_rdn;
    if (!a_rdn_sequence.ReadConstructed(CBS_ASN1_SET, &a_rdn) ||
        !b_rdn_sequence.ReadConstructed(CBS_ASN1_SET, &b_rdn)) {
      return false;
    }
    if (!VerifyRdnMatch(&a_rdn, &b_rdn)) {
      return false;
    }
  }

  return true;
}